

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_heresiarch.cpp
# Opt level: O1

int AF_A_SpawnFizzle(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  double dVar1;
  VM_UBYTE VVar2;
  AActor *this;
  undefined8 *puVar3;
  double dVar4;
  double dVar5;
  PClass *pPVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  undefined8 uVar9;
  PClass *pPVar10;
  PClassActor *type;
  AActor *pAVar11;
  char *__assertion;
  bool bVar12;
  DVector3 pos;
  FName local_5c;
  double local_58;
  DAngle local_50;
  DVector3 local_48;
  
  pPVar6 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005b83ad;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    this = (AActor *)(param->field_0).field_1.a;
    if (this != (AActor *)0x0) {
      if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar7 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
        (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar7);
      }
      pPVar10 = (this->super_DThinker).super_DObject.Class;
      bVar12 = pPVar10 != (PClass *)0x0;
      if (pPVar10 != pPVar6 && bVar12) {
        do {
          pPVar10 = pPVar10->ParentClass;
          bVar12 = pPVar10 != (PClass *)0x0;
          if (pPVar10 == pPVar6) break;
        } while (pPVar10 != (PClass *)0x0);
      }
      if (!bVar12) {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005b83ad;
      }
    }
    pPVar6 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar2 = param[1].field_0.field_3.Type, VVar2 != 0xff)) {
      if ((VVar2 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005b8382;
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar9 = (**(code **)*puVar3)(puVar3);
          puVar3[1] = uVar9;
        }
        pPVar10 = (PClass *)puVar3[1];
        bVar12 = pPVar10 != (PClass *)0x0;
        if (pPVar10 != pPVar6 && bVar12) {
          do {
            pPVar10 = pPVar10->ParentClass;
            bVar12 = pPVar10 != (PClass *)0x0;
            if (pPVar10 == pPVar6) break;
          } while (pPVar10 != (PClass *)0x0);
        }
        if (!bVar12) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005b83ad;
        }
      }
    }
    if (((numparam < 3) || (VVar2 = param[2].field_0.field_3.Type, VVar2 == 0xff)) ||
       ((VVar2 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      dVar1 = this->Speed;
      local_50.Degrees = (this->Angles).Yaw.Degrees;
      AActor::Vec3Angle(&local_48,this,5.0,&local_50,this->Height * 0.5 - this->Floorclip,false);
      iVar7 = 5;
      do {
        local_5c.Index = FName::NameManager::FindName(&FName::NameData,"SorcSpark1",false);
        type = ClassForSpawn(&local_5c);
        pAVar11 = AActor::StaticSpawn(type,&local_48,ALLOW_REPLACE,false);
        if (pAVar11 != (AActor *)0x0) {
          uVar8 = FRandom::GenRand32(&pr_heresiarch);
          local_58 = (double)((uVar8 & 0xff) % 5) * 11.377777777777778 + (this->Angles).Yaw.Degrees;
          uVar8 = FRandom::GenRand32(&pr_heresiarch);
          dVar4 = FFastTrig::cos(&fasttrig,local_58 * 11930464.711111112 + 6755399441055744.0);
          (pAVar11->Vel).X = dVar4 * (double)(int)((long)(ulong)(uVar8 & 0xff) % (long)(int)dVar1);
          uVar8 = FRandom::GenRand32(&pr_heresiarch);
          dVar4 = (double)(int)((long)(ulong)(uVar8 & 0xff) % (long)(int)dVar1);
          dVar5 = FFastTrig::sin(&fasttrig,dVar4);
          (pAVar11->Vel).Y = dVar5 * dVar4;
          (pAVar11->Vel).Z = 2.0;
        }
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005b8382:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005b83ad:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                ,0x2b3,"int AF_A_SpawnFizzle(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SpawnFizzle)
{
	PARAM_ACTION_PROLOGUE;
	int speed = (int)self->Speed;
	DAngle rangle;
	AActor *mo;
	int ix;

	DVector3 pos = self->Vec3Angle(5., self->Angles.Yaw, -self->Floorclip + self->Height / 2. );
	for (ix=0; ix<5; ix++)
	{
		mo = Spawn("SorcSpark1", pos, ALLOW_REPLACE);
		if (mo)
		{
			rangle = self->Angles.Yaw + (pr_heresiarch() % 5) * (4096 / 360.);
			mo->Vel.X = (pr_heresiarch() % speed) * rangle.Cos();
			mo->Vel.Y = (pr_heresiarch() % speed) * rangle.Sin();
			mo->Vel.Z = 2;
		}
	}
	return 0;
}